

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChannelList.cpp
# Opt level: O3

bool __thiscall Imf_3_4::ChannelList::operator==(ChannelList *this,ChannelList *other)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  _Rb_tree_header *p_Var4;
  bool bVar5;
  
  p_Var1 = (this->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = (other->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(this->_map)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = &(other->_map)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3 && (_Rb_tree_header *)p_Var1 != p_Var4) {
    do {
      if ((((p_Var1[9]._M_color != p_Var2[9]._M_color) ||
           (*(int *)&p_Var1[9].field_0x4 != *(int *)&p_Var2[9].field_0x4)) ||
          (*(int *)&p_Var1[9]._M_parent != *(int *)&p_Var2[9]._M_parent)) ||
         (*(char *)((long)&p_Var1[9]._M_parent + 4) != *(char *)((long)&p_Var2[9]._M_parent + 4)))
      goto LAB_00158f34;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while (((_Rb_tree_header *)p_Var1 != p_Var4) && ((_Rb_tree_header *)p_Var2 != p_Var3));
  }
  if ((_Rb_tree_header *)p_Var1 == p_Var4) {
    bVar5 = (_Rb_tree_header *)p_Var2 == p_Var3;
  }
  else {
LAB_00158f34:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool
ChannelList::operator== (const ChannelList& other) const
{
    ConstIterator i = begin ();
    ConstIterator j = other.begin ();

    while (i != end () && j != other.end ())
    {
        if (!(i.channel () == j.channel ())) return false;

        ++i;
        ++j;
    }

    return i == end () && j == other.end ();
}